

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squtils.h
# Opt level: O1

void __thiscall sqvector<SQOuterVar>::~sqvector(sqvector<SQOuterVar> *this)

{
  SQOuterVar *pSVar1;
  long lVar2;
  ulong uVar3;
  
  if (this->_allocated != 0) {
    if (this->_size != 0) {
      lVar2 = 0x18;
      uVar3 = 0;
      do {
        pSVar1 = this->_vals;
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)((long)&pSVar1->_type + lVar2));
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)((long)pSVar1 + lVar2 + -0x10));
        uVar3 = uVar3 + 1;
        lVar2 = lVar2 + 0x28;
      } while (uVar3 < this->_size);
    }
    sq_vm_free(this->_vals,this->_allocated * 0x28);
  }
  return;
}

Assistant:

~sqvector()
    {
        if(_allocated) {
            for(SQUnsignedInteger i = 0; i < _size; i++)
                _vals[i].~T();
            SQ_FREE(_vals, (_allocated * sizeof(T)));
        }
    }